

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.hpp
# Opt level: O0

void just::temp::directory::delete_empty_dir(string *path_)

{
  int iVar1;
  char *__path;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  string *local_10;
  string *path__local;
  
  local_10 = path_;
  __path = (char *)std::__cxx11::string::c_str();
  iVar1 = rmdir(__path);
  if (iVar1 != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_30,"Error deleting empty directory ",local_10);
    std::runtime_error::runtime_error(this,(string *)&local_30);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

static void delete_empty_dir(const std::string& path_)
      {
#ifdef _WIN32
        if (!RemoveDirectory(path_.c_str()))
#else
        if (rmdir(path_.c_str()))
#endif
        {
          throw std::runtime_error("Error deleting empty directory " + path_);
        }
      }